

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

void __thiscall SQTable::Remove(SQTable *this,SQObjectPtr *key)

{
  SQHash SVar1;
  _HashNode *this_00;
  
  SVar1 = HashObj(key);
  this_00 = _Get(this,key,this->_numofnodes - 1U & SVar1);
  if (this_00 != (_HashNode *)0x0) {
    SQObjectPtr::Null(&this_00->val);
    SQObjectPtr::Null(&this_00->key);
    this->_usednodes = this->_usednodes + -1;
    Rehash(this,false);
    return;
  }
  return;
}

Assistant:

void SQTable::Remove(const SQObjectPtr &key)
{

    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        n->val.Null();
        n->key.Null();
        _usednodes--;
        Rehash(false);
    }
}